

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

lws_role_ops * lws_role_by_name(char *name)

{
  lws_role_ops *plVar1;
  int iVar2;
  lws_role_ops *unaff_R14;
  lws_role_ops *plVar3;
  lws_role_ops **ppxx;
  lws_role_ops **pplVar4;
  
  pplVar4 = available_roles;
  do {
    plVar1 = *pplVar4;
    plVar3 = unaff_R14;
    if (plVar1 == (lws_role_ops *)0x0) break;
    pplVar4 = pplVar4 + 1;
    iVar2 = strcmp(plVar1->name,name);
    plVar3 = plVar1;
  } while (iVar2 != 0);
  if (plVar1 == (lws_role_ops *)0x0) {
    plVar3 = &role_ops_raw_skt;
    iVar2 = strcmp(name,"raw-skt");
    if (iVar2 != 0) {
      iVar2 = strcmp(name,"raw-file");
      plVar3 = (lws_role_ops *)0x0;
      if (iVar2 == 0) {
        plVar3 = &role_ops_raw_file;
      }
    }
  }
  return plVar3;
}

Assistant:

const struct lws_role_ops *
lws_role_by_name(const char *name)
{
	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (!strcmp(ar->name, name))
			return ar;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	if (!strcmp(name, role_ops_raw_skt.name))
		return &role_ops_raw_skt;

	if (!strcmp(name, role_ops_raw_file.name))
		return &role_ops_raw_file;

	return NULL;
}